

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,Transformations *spaces,Ref<embree::SceneGraph::Node> *child)

{
  Node *pNVar1;
  
  Node::Node(&this->super_Node,false);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__TransformNode_0024ac88;
  Transformations::Transformations(&this->spaces,spaces);
  pNVar1 = child->ptr;
  (this->child).ptr = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

TransformNode(const Transformations& spaces, const Ref<Node>& child)
        : spaces(spaces), child(child) {}